

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O2

bool __thiscall Js::ByteCodeWriter::ShouldIncrementCallSiteId(ByteCodeWriter *this,OpCode op)

{
  bool bVar1;
  
  if (((ushort)(op - CallI) < 4) && (bVar1 = DoDynamicProfileOpcode(this,InlinePhase,false), bVar1))
  {
    return true;
  }
  bVar1 = DoProfileNewScObjArrayOp(this,op);
  if (bVar1) {
    bVar1 = DoDynamicProfileOpcode(this,NativeArrayPhase,true);
    if (bVar1) {
      return true;
    }
    bVar1 = DoDynamicProfileOpcode(this,InlinePhase,true);
    if (bVar1) {
      return true;
    }
  }
  bVar1 = DoProfileNewScObjectOp(this,op);
  if (bVar1) {
    bVar1 = DoDynamicProfileOpcode(this,InlinePhase,true);
    if (bVar1) {
      return true;
    }
    bVar1 = DoDynamicProfileOpcode(this,FixedNewObjPhase,true);
    if (bVar1) {
      return true;
    }
  }
  return false;
}

Assistant:

bool ByteCodeWriter::ShouldIncrementCallSiteId(OpCode op)
    {
        if ((DoProfileCallOp(op) && DoDynamicProfileOpcode(InlinePhase)) ||
            (DoProfileNewScObjArrayOp(op) && (DoDynamicProfileOpcode(NativeArrayPhase, true) || DoDynamicProfileOpcode(InlinePhase, true))) ||
            (DoProfileNewScObjectOp(op) && (DoDynamicProfileOpcode(InlinePhase, true) || DoDynamicProfileOpcode(FixedNewObjPhase, true))))
        {
            return true;
        }
        return false;
    }